

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adhuff_common.c
# Opt level: O1

void adh_update_tree(adh_node_t *node,_Bool is_new_node)

{
  adh_node_t *node2;
  hash_entry_t *entry;
  undefined7 in_register_00000031;
  
  if ((int)CONCAT71(in_register_00000031,is_new_node) == 0) goto LAB_001023df;
  while( true ) {
    node = node->parent;
LAB_001023df:
    if ((node == (adh_node_t *)0x0) || (node == adh_root_node)) break;
    if (node->weight == 0) {
      node2 = (adh_node_t *)0x0;
    }
    else {
      node2 = hash_get_value(node->weight,node->order);
    }
    if (node2 != (adh_node_t *)0x0) {
      swap_nodes(node,node2);
    }
    entry = hash_detach_entry(node);
    node->weight = node->weight + 1;
    hash_add(node,entry);
  }
  increase_weight(node);
  return;
}

Assistant:

void adh_update_tree(adh_node_t *node, bool is_new_node) {
#ifdef _DEBUG
    log_debug("  adh_update_tree", "%s is_new=%d\n",
              fmt_node(node), is_new_node);
#endif

    // create node_to_check
    adh_node_t * node_to_check = is_new_node ? node->parent : node;
    while(node_to_check != NULL && node_to_check != adh_root_node) {
        // search in tree node with same weight and higher order
        adh_node_t * node_to_swap = find_higher_order_same_weight(node_to_check->weight,
                                                                  node_to_check->order);


        // if node_to_swap == NULL, then no swap is needed
        if (node_to_swap != NULL) {
#ifdef _DEBUG
            log_tree();
#endif
            swap_nodes(node_to_check, node_to_swap);
        }
        // now we can safely update the weight of the node
        increase_weight(node_to_check);

        // continue ascending the tree
        node_to_check = node_to_check->parent;
    }

    increase_weight(node_to_check);

#ifdef _DEBUG
    log_tree();
#endif
}